

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglImageTests.cpp
# Opt level: O2

int __thiscall deqp::egl::Image::ApiTests::init(ApiTests *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  TestNode *node;
  CreateImageGLES2 *pCVar1;
  ImageTargetGLES2 *pIVar2;
  long lVar3;
  
  node = (TestNode *)operator_new(0x1ac8);
  InvalidCreateImage::InvalidCreateImage
            ((InvalidCreateImage *)node,(this->super_TestCaseGroup).m_eglTestCtx);
  tcu::TestNode::addChild((TestNode *)this,node);
  pCVar1 = (CreateImageGLES2 *)operator_new(0x1ae0);
  CreateImageGLES2::CreateImageGLES2
            (pCVar1,(this->super_TestCaseGroup).m_eglTestCtx,0x30b1,0x1903,0x1903,0x1401,false);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pCVar1);
  pCVar1 = (CreateImageGLES2 *)operator_new(0x1ae0);
  CreateImageGLES2::CreateImageGLES2
            (pCVar1,(this->super_TestCaseGroup).m_eglTestCtx,0x30b1,0x8227,0x8227,0x1401,false);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pCVar1);
  pCVar1 = (CreateImageGLES2 *)operator_new(0x1ae0);
  CreateImageGLES2::CreateImageGLES2
            (pCVar1,(this->super_TestCaseGroup).m_eglTestCtx,0x30b1,0x1909,0x1909,0x1401,false);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pCVar1);
  pCVar1 = (CreateImageGLES2 *)operator_new(0x1ae0);
  CreateImageGLES2::CreateImageGLES2
            (pCVar1,(this->super_TestCaseGroup).m_eglTestCtx,0x30b1,0x190a,0x190a,0x1401,false);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pCVar1);
  pCVar1 = (CreateImageGLES2 *)operator_new(0x1ae0);
  CreateImageGLES2::CreateImageGLES2
            (pCVar1,(this->super_TestCaseGroup).m_eglTestCtx,0x30b1,0x1907,0x1907,0x1401,false);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pCVar1);
  pCVar1 = (CreateImageGLES2 *)operator_new(0x1ae0);
  CreateImageGLES2::CreateImageGLES2
            (pCVar1,(this->super_TestCaseGroup).m_eglTestCtx,0x30b1,0x1908,0x1908,0x1401,false);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pCVar1);
  pCVar1 = (CreateImageGLES2 *)operator_new(0x1ae0);
  CreateImageGLES2::CreateImageGLES2
            (pCVar1,(this->super_TestCaseGroup).m_eglTestCtx,0x30b1,0x1908,0x1908,0x1401,true);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pCVar1);
  pCVar1 = (CreateImageGLES2 *)operator_new(0x1ae0);
  CreateImageGLES2::CreateImageGLES2
            (pCVar1,(this->super_TestCaseGroup).m_eglTestCtx,0x30b3,0x1907,0x1907,0x1401,false);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pCVar1);
  pCVar1 = (CreateImageGLES2 *)operator_new(0x1ae0);
  CreateImageGLES2::CreateImageGLES2
            (pCVar1,(this->super_TestCaseGroup).m_eglTestCtx,0x30b3,0x1908,0x1908,0x1401,false);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pCVar1);
  pCVar1 = (CreateImageGLES2 *)operator_new(0x1ae0);
  CreateImageGLES2::CreateImageGLES2
            (pCVar1,(this->super_TestCaseGroup).m_eglTestCtx,0x30b3,0x1908,0x1908,0x1401,true);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pCVar1);
  pCVar1 = (CreateImageGLES2 *)operator_new(0x1ae0);
  CreateImageGLES2::CreateImageGLES2
            (pCVar1,(this->super_TestCaseGroup).m_eglTestCtx,0x30b4,0x1908,0x1908,0x1401,false);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pCVar1);
  pCVar1 = (CreateImageGLES2 *)operator_new(0x1ae0);
  CreateImageGLES2::CreateImageGLES2
            (pCVar1,(this->super_TestCaseGroup).m_eglTestCtx,0x30b5,0x1908,0x1908,0x1401,false);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pCVar1);
  pCVar1 = (CreateImageGLES2 *)operator_new(0x1ae0);
  CreateImageGLES2::CreateImageGLES2
            (pCVar1,(this->super_TestCaseGroup).m_eglTestCtx,0x30b6,0x1908,0x1908,0x1401,false);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pCVar1);
  pCVar1 = (CreateImageGLES2 *)operator_new(0x1ae0);
  CreateImageGLES2::CreateImageGLES2
            (pCVar1,(this->super_TestCaseGroup).m_eglTestCtx,0x30b7,0x1908,0x1908,0x1401,false);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pCVar1);
  pCVar1 = (CreateImageGLES2 *)operator_new(0x1ae0);
  CreateImageGLES2::CreateImageGLES2
            (pCVar1,(this->super_TestCaseGroup).m_eglTestCtx,0x30b8,0x1908,0x1908,0x1401,false);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pCVar1);
  for (lVar3 = 0; lVar3 != 0x14; lVar3 = lVar3 + 4) {
    pCVar1 = (CreateImageGLES2 *)operator_new(0x1ae0);
    CreateImageGLES2::CreateImageGLES2
              (pCVar1,(this->super_TestCaseGroup).m_eglTestCtx,0x30b9,
               *(GLenum *)((long)init::rboStorages + lVar3),0,0,false);
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pCVar1);
  }
  for (lVar3 = 0; lVar3 != 0x14; lVar3 = lVar3 + 4) {
    pCVar1 = (CreateImageGLES2 *)operator_new(0x1ae0);
    CreateImageGLES2::CreateImageGLES2
              (pCVar1,(this->super_TestCaseGroup).m_eglTestCtx,0x3140,
               *(GLenum *)((long)init::androidFormats + lVar3),0,0,false);
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pCVar1);
  }
  pIVar2 = (ImageTargetGLES2 *)operator_new(0x1ad0);
  ImageTargetGLES2::ImageTargetGLES2(pIVar2,(this->super_TestCaseGroup).m_eglTestCtx,0xde1);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pIVar2);
  pIVar2 = (ImageTargetGLES2 *)operator_new(0x1ad0);
  ImageTargetGLES2::ImageTargetGLES2(pIVar2,(this->super_TestCaseGroup).m_eglTestCtx,0x8d41);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pIVar2);
  return extraout_EAX;
}

Assistant:

void init (void)
	{
		addChild(new Image::InvalidCreateImage(m_eglTestCtx));

		addChild(new Image::CreateImageGLES2(m_eglTestCtx, EGL_GL_TEXTURE_2D_KHR, GL_RED, GL_RED, GL_UNSIGNED_BYTE, false));
		addChild(new Image::CreateImageGLES2(m_eglTestCtx, EGL_GL_TEXTURE_2D_KHR, GL_RG, GL_RG, GL_UNSIGNED_BYTE, false));

		addChild(new Image::CreateImageGLES2(m_eglTestCtx, EGL_GL_TEXTURE_2D_KHR, GL_LUMINANCE, GL_LUMINANCE, GL_UNSIGNED_BYTE));
		addChild(new Image::CreateImageGLES2(m_eglTestCtx, EGL_GL_TEXTURE_2D_KHR, GL_LUMINANCE_ALPHA, GL_LUMINANCE_ALPHA, GL_UNSIGNED_BYTE));

		addChild(new Image::CreateImageGLES2(m_eglTestCtx, EGL_GL_TEXTURE_2D_KHR, GL_RGB, GL_RGB, GL_UNSIGNED_BYTE));
		addChild(new Image::CreateImageGLES2(m_eglTestCtx, EGL_GL_TEXTURE_2D_KHR, GL_RGBA, GL_RGBA, GL_UNSIGNED_BYTE));
		addChild(new Image::CreateImageGLES2(m_eglTestCtx, EGL_GL_TEXTURE_2D_KHR, GL_RGBA, GL_RGBA, GL_UNSIGNED_BYTE, true));

		addChild(new Image::CreateImageGLES2(m_eglTestCtx, EGL_GL_TEXTURE_CUBE_MAP_POSITIVE_X_KHR, GL_RGB, GL_RGB, GL_UNSIGNED_BYTE));
		addChild(new Image::CreateImageGLES2(m_eglTestCtx, EGL_GL_TEXTURE_CUBE_MAP_POSITIVE_X_KHR, GL_RGBA, GL_RGBA, GL_UNSIGNED_BYTE));
		addChild(new Image::CreateImageGLES2(m_eglTestCtx, EGL_GL_TEXTURE_CUBE_MAP_POSITIVE_X_KHR, GL_RGBA, GL_RGBA, GL_UNSIGNED_BYTE, true));

		addChild(new Image::CreateImageGLES2(m_eglTestCtx, EGL_GL_TEXTURE_CUBE_MAP_NEGATIVE_X_KHR, GL_RGBA, GL_RGBA, GL_UNSIGNED_BYTE));
		addChild(new Image::CreateImageGLES2(m_eglTestCtx, EGL_GL_TEXTURE_CUBE_MAP_POSITIVE_Y_KHR, GL_RGBA, GL_RGBA, GL_UNSIGNED_BYTE));
		addChild(new Image::CreateImageGLES2(m_eglTestCtx, EGL_GL_TEXTURE_CUBE_MAP_NEGATIVE_Y_KHR, GL_RGBA, GL_RGBA, GL_UNSIGNED_BYTE));
		addChild(new Image::CreateImageGLES2(m_eglTestCtx, EGL_GL_TEXTURE_CUBE_MAP_POSITIVE_Z_KHR, GL_RGBA, GL_RGBA, GL_UNSIGNED_BYTE));
		addChild(new Image::CreateImageGLES2(m_eglTestCtx, EGL_GL_TEXTURE_CUBE_MAP_NEGATIVE_Z_KHR, GL_RGBA, GL_RGBA, GL_UNSIGNED_BYTE));

		static const GLenum rboStorages[] =
		{
			GL_DEPTH_COMPONENT16,
			GL_RGBA4,
			GL_RGB5_A1,
			GL_RGB565,
			GL_STENCIL_INDEX8
		};
		for (int storageNdx = 0; storageNdx < DE_LENGTH_OF_ARRAY(rboStorages); storageNdx++)
			addChild(new Image::CreateImageGLES2(m_eglTestCtx, EGL_GL_RENDERBUFFER_KHR, rboStorages[storageNdx], (GLenum)0, (GLenum)0));

		static const GLenum androidFormats[] =
		{
			GL_RGB565,
			GL_RGB8,
			GL_RGBA4,
			GL_RGB5_A1,
			GL_RGBA8,
		};

		for (int formatNdx = 0; formatNdx < DE_LENGTH_OF_ARRAY(androidFormats); ++formatNdx)
			addChild(new Image::CreateImageGLES2(m_eglTestCtx, EGL_NATIVE_BUFFER_ANDROID, androidFormats[formatNdx], (GLenum)0, (GLenum)0));

		addChild(new Image::ImageTargetGLES2(m_eglTestCtx, GL_TEXTURE_2D));
		addChild(new Image::ImageTargetGLES2(m_eglTestCtx, GL_RENDERBUFFER));
	}